

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::initData
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  AllocateResult AVar1;
  ThrowOverflow local_19;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (size < 0x20000000) {
    AVar1 = BuilderArena::allocate(arena,size + 7 >> 3);
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(ByteCount *)((long)&(__return_storage_ptr__->tag).content + 4) = size * 8 + 2;
    __return_storage_ptr__->segment = AVar1.segment;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->location = AVar1.words;
    return __return_storage_ptr__;
  }
  kj::ThrowOverflow::operator()(&local_19);
}

Assistant:

OrphanBuilder OrphanBuilder::initData(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initDataPointer(result.tagAsPtr(), nullptr, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}